

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall symbols::StringObject::~StringObject(StringObject *this)

{
  ~StringObject(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~StringObject(){

    }